

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_art_oom.cpp
# Opt level: O0

void __thiscall
anon_unknown.dwarf_f278::
ARTOOMTest_Node256ShrinkToNode48_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
::~ARTOOMTest_Node256ShrinkToNode48_Test
          (ARTOOMTest_Node256ShrinkToNode48_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
           *this)

{
  ARTOOMTest_Node256ShrinkToNode48_Test<unodb::olc_db<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>_>_>
  *this_local;
  
  ~ARTOOMTest_Node256ShrinkToNode48_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TYPED_TEST(ARTOOMTest, Node256ShrinkToNode48) {
  oom_remove_test<TypeParam>(
      2,
      [](unodb::test::tree_verifier<TypeParam>& verifier) {
        verifier.insert_key_range(1, 49);
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_node_counts({49, 0, 0, 0, 1});
        verifier.assert_shrinking_inodes({0, 0, 0, 0});
#endif  // UNODB_DETAIL_WITH_STATS
      },
      25,
      [](unodb::test::tree_verifier<TypeParam>&
#ifdef UNODB_DETAIL_WITH_STATS
             verifier
#endif  // UNODB_DETAIL_WITH_STATS
      ) {
#ifdef UNODB_DETAIL_WITH_STATS
        verifier.assert_shrinking_inodes({0, 0, 0, 1});
        verifier.assert_node_counts({48, 0, 0, 1, 0});
#endif  // UNODB_DETAIL_WITH_STATS
      });
}